

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABBcollider.cpp
# Opt level: O3

void __thiscall
chrono::collision::CHAABBcollider::CollideRecurse
          (CHAABBcollider *this,CHAABBTree *o1,int b1,CHAABBTree *o2,int b2,eCollMode flag)

{
  int *piVar1;
  ChMatrix33<double> *B;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint b1_00;
  uint b2_00;
  int iVar6;
  bool bVar7;
  CHAABB *b1_01;
  CHAABB *b2_01;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector local_48;
  
  b1_01 = (o1->b).
          super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>.
          _M_impl.super__Vector_impl_data._M_start + b1;
  b2_01 = (o2->b).
          super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>.
          _M_impl.super__Vector_impl_data._M_start + b2;
  piVar1 = &(this->super_ChNarrowPhaseCollider).num_bv_tests;
  *piVar1 = *piVar1 + 1;
  if (CollideRecurse(chrono::collision::CHAABBTree*,int,chrono::collision::CHAABBTree*,int,chrono::collision::ChNarrowPhaseCollider::eCollMode)
      ::Translation == '\0') {
    CollideRecurse();
  }
  dVar2 = (b2_01->To).m_data[1];
  dVar3 = (b2_01->To).m_data[0];
  auVar14._8_8_ = dVar3;
  auVar14._0_8_ = dVar3;
  dVar3 = (b2_01->To).m_data[2];
  auVar16._8_8_ = dVar3;
  auVar16._0_8_ = dVar3;
  B = &(this->super_ChNarrowPhaseCollider).R;
  auVar8 = vmovhpd_avx(*(undefined1 (*) [16])
                        ((long)(this->super_ChNarrowPhaseCollider).R.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 8),
                       *(double *)
                        ((long)(this->super_ChNarrowPhaseCollider).R.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x20));
  auVar9 = vsubpd_avx(*(undefined1 (*) [16])(this->super_ChNarrowPhaseCollider).T.m_data,
                      *(undefined1 (*) [16])(b1_01->To).m_data);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)(this->super_ChNarrowPhaseCollider).R.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x30);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       dVar2 * *(double *)
                ((long)(this->super_ChNarrowPhaseCollider).R.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x38);
  auVar4 = vfmadd231sd_fma(auVar12,auVar14,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)(this->super_ChNarrowPhaseCollider).R.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x40);
  auVar4 = vfmadd231sd_fma(auVar4,auVar16,auVar5);
  auVar10._0_8_ = dVar2 * auVar8._0_8_;
  auVar10._8_8_ = dVar2 * auVar8._8_8_;
  local_48.m_data[2] =
       ((this->super_ChNarrowPhaseCollider).T.m_data[2] - (b1_01->To).m_data[2]) + auVar4._0_8_;
  auVar4 = vmovhpd_avx(*(undefined1 (*) [16])
                        (this->super_ChNarrowPhaseCollider).R.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array,
                       *(double *)
                        ((long)(this->super_ChNarrowPhaseCollider).R.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x18));
  auVar5 = vfmadd213pd_fma(auVar4,auVar14,auVar10);
  auVar4 = vmovhpd_avx(*(undefined1 (*) [16])
                        ((long)(this->super_ChNarrowPhaseCollider).R.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x10),
                       *(double *)
                        ((long)(this->super_ChNarrowPhaseCollider).R.
                               super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 0x28));
  auVar4 = vfmadd213pd_fma(auVar4,auVar16,auVar5);
  local_48.m_data[0] = auVar9._0_8_ + auVar4._0_8_;
  local_48.m_data[1] = auVar9._8_8_ + auVar4._8_8_;
  bVar7 = CHAABB::AABB_Overlap(B,&this->Rabs,&local_48,b1_01,b2_01);
  if (!bVar7) {
    return;
  }
  b1_00 = b1_01->first_child;
  b2_00 = b2_01->first_child;
  if ((int)(b2_00 & b1_00) < 0) {
    piVar1 = &(this->super_ChNarrowPhaseCollider).num_geo_tests;
    *piVar1 = *piVar1 + 1;
    ChGeometryCollider::ComputeCollisions
              ((o1->super_ChCollisionTree).geometries.
               super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)~b1_00],
               &(this->super_ChNarrowPhaseCollider).R1,&(this->super_ChNarrowPhaseCollider).T1,
               (o2->super_ChCollisionTree).geometries.
               super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)~b2_00],
               &(this->super_ChNarrowPhaseCollider).R2,&(this->super_ChNarrowPhaseCollider).T2,
               &this->super_ChNarrowPhaseCollider,B,&(this->super_ChNarrowPhaseCollider).T,
               flag == ChC_FIRST_CONTACT);
    return;
  }
  if ((int)b2_00 < 0) {
LAB_00834c88:
    b1 = b1_00 + 1;
    CollideRecurse(this,o1,b1_00,o2,b2,flag);
    if (flag != ChC_FIRST_CONTACT) goto LAB_00834da7;
    iVar6 = (this->super_ChNarrowPhaseCollider).num_collision_pairs;
  }
  else {
    if (-1 < (int)b1_00) {
      dVar2 = (b2_01->d).m_data[1];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (b2_01->d).m_data[0];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (b2_01->d).m_data[2];
      dVar3 = (b1_01->d).m_data[1];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (b1_01->d).m_data[0];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar2 * dVar2;
      auVar4 = vfmadd231sd_fma(auVar13,auVar11,auVar11);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar3 * dVar3;
      auVar5 = vfmadd231sd_fma(auVar15,auVar17,auVar17);
      auVar4 = vfmadd231sd_fma(auVar4,auVar8,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (b1_01->d).m_data[2];
      auVar5 = vfmadd231sd_fma(auVar5,auVar9,auVar9);
      if (auVar4._0_8_ < auVar5._0_8_) goto LAB_00834c88;
    }
    b2 = b2_00 + 1;
    CollideRecurse(this,o1,b1,o2,b2_00,flag);
    if (flag != ChC_FIRST_CONTACT) goto LAB_00834da7;
    iVar6 = (this->super_ChNarrowPhaseCollider).num_collision_pairs;
  }
  if (0 < iVar6) {
    return;
  }
  flag = ChC_FIRST_CONTACT;
LAB_00834da7:
  CollideRecurse(this,o1,b1,o2,b2,flag);
  return;
}

Assistant:

void CHAABBcollider::CollideRecurse(CHAABBTree* o1, int b1, CHAABBTree* o2, int b2, eCollMode flag) {
    CHAABB* box1 = o1->child(b1);
    CHAABB* box2 = o2->child(b2);

    this->num_bv_tests++;

    // first thing, see if we're overlapping

    static Vector Translation;
    Translation = Vsub(this->T, box1->To);
    Translation = Vadd(Translation, this->R * box2->To);

    if (!CHAABB::AABB_Overlap(this->R, this->Rabs, Translation, box1, box2))
        return;

    // if we are, see if we test triangles next

    int l1 = box1->IsLeaf();
    int l2 = box2->IsLeaf();

    //
    // CASE TWO LEAVES
    //

    if (l1 && l2) {
        this->num_geo_tests++;

        // transform the points in b2 into space of b1, then compare

        geometry::ChGeometry* mgeo1 = o1->geometries[box1->GetGeometryIndex()];
        geometry::ChGeometry* mgeo2 = o2->geometries[box2->GetGeometryIndex()];

        bool just_intersect = false;
        if (flag == ChNarrowPhaseCollider::ChC_FIRST_CONTACT)
            just_intersect = true;

        ChGeometryCollider::ComputeCollisions(*mgeo1, &this->R1, &this->T1, *mgeo2, &this->R2, &this->T2, *this,
                                              &this->R, &this->T, just_intersect);
        return;
    }

    // we dont, so decide whose children to visit next

    double sz1 = box1->GetSize();
    double sz2 = box2->GetSize();

    if (l2 || (!l1 && (sz1 > sz2))) {
        int c1 = box1->GetFirstChildIndex();
        int c2 = box1->GetSecondChildIndex();

        CollideRecurse(o1, c1, o2, b2, flag);

        if ((flag == ChC_FIRST_CONTACT) && (this->GetNumPairs() > 0))
            return;

        CollideRecurse(o1, c2, o2, b2, flag);
    } else {
        int c1 = box2->GetFirstChildIndex();
        int c2 = box2->GetSecondChildIndex();

        CollideRecurse(o1, b1, o2, c1, flag);

        if ((flag == ChC_FIRST_CONTACT) && (this->GetNumPairs() > 0))
            return;

        CollideRecurse(o1, b1, o2, c2, flag);
    }
}